

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O0

void handle_removed_ev(cio_eventloop *loop,cio_event_notifier *evn,uint32_t events_type)

{
  cio_epoll_error local_20;
  cio_epoll_error err;
  uint32_t events_type_local;
  cio_event_notifier *evn_local;
  cio_eventloop *loop_local;
  
  if ((loop->current_ev != (cio_event_notifier *)0x0) &&
     ((events_type & 4 & evn->registered_events) != 0)) {
    local_20 = CIO_EPOLL_SUCCESS;
    if ((events_type & 8) != 0 || (events_type & 0x10) != 0) {
      local_20 = CIO_EPOLL_ERROR;
    }
    cio_linux_eventloop_unregister_write(loop,evn);
    (*evn->write_callback)(evn->context,local_20);
  }
  return;
}

Assistant:

static void handle_removed_ev(const struct cio_eventloop *loop, struct cio_event_notifier *evn, uint32_t events_type)
{
	if (cio_likely(loop->current_ev != NULL) && ((events_type & (uint32_t)EPOLLOUT & evn->registered_events) != 0)) {
		enum cio_epoll_error err = CIO_EPOLL_SUCCESS;
		if (cio_unlikely(((events_type & (uint32_t)EPOLLERR) != 0) || ((events_type & (uint32_t)EPOLLHUP) != 0))) {
			err = CIO_EPOLL_ERROR;
		}

		cio_linux_eventloop_unregister_write(loop, evn);
		evn->write_callback(evn->context, err);
	}
}